

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkIvyAfter(Abc_Ntk_t *pNtk,Ivy_Man_t *pMan,int fSeq,int fHaig)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  void *pvVar5;
  void **ppvVar6;
  long *plVar7;
  int iVar8;
  Abc_Ntk_t *pAVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pObj;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar12;
  ulong uVar13;
  Vec_Ptr_t *pVVar14;
  Vec_Int_t *pVVar15;
  Abc_Ntk_t *pAVar16;
  ulong uVar17;
  void *pvVar18;
  size_t __size;
  uint uVar19;
  ulong uVar20;
  char *__ptr;
  uint uVar21;
  uint uVar22;
  long lVar23;
  Vec_Int_t *local_50;
  Abc_Ntk_t *local_48;
  Vec_Int_t *local_40;
  Abc_Ntk_t *local_38;
  
  if (fSeq == 0) {
    pAVar9 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pAVar10 = Abc_AigConst1(pAVar9);
    pMan->pConst1->TravId =
         ((uint)pAVar10 & 1) + *(int *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x10) * 2;
    pVVar14 = pNtk->vCis;
    uVar17 = (ulong)pVVar14->nSize;
    if (0 < (long)uVar17) {
      pVVar3 = pMan->vPis;
      uVar21 = pVVar3->nSize;
      uVar20 = 0;
      uVar13 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar13 = uVar20;
      }
      do {
        if (uVar13 == uVar20) goto LAB_002d6dbc;
        uVar4 = *(ulong *)((long)pVVar14->pArray[uVar20] + 0x40);
        *(uint *)((long)pVVar3->pArray[uVar20] + 4) =
             ((uint)uVar4 & 1) + *(int *)((uVar4 & 0xfffffffffffffffe) + 0x10) * 2;
        uVar20 = uVar20 + 1;
      } while (uVar17 != uVar20);
    }
    pVVar15 = Ivy_ManDfs(pMan);
    iVar8 = pVVar15->nSize;
    if (0 < iVar8) {
      lVar23 = 0;
      do {
        iVar2 = pVVar15->pArray[lVar23];
        if (((long)iVar2 < 0) || (pMan->vObjs->nSize <= iVar2)) goto LAB_002d6dbc;
        pvVar5 = pMan->vObjs->pArray[iVar2];
        if (pvVar5 == (void *)0x0) break;
        uVar21 = *(uint *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) + 4);
        uVar19 = (int)uVar21 >> 1;
        if ((int)uVar19 < 0) goto LAB_002d6dbc;
        uVar1 = pAVar9->vObjs->nSize;
        if ((int)uVar1 <= (int)uVar19) goto LAB_002d6dbc;
        ppvVar6 = pAVar9->vObjs->pArray;
        pvVar18 = ppvVar6[uVar19];
        pAVar10 = (Abc_Obj_t *)
                  ((ulong)(((uint)*(ulong *)((long)pvVar5 + 0x10) ^ uVar21) & 1) ^ (ulong)pvVar18);
        uVar21 = *(uint *)((long)pvVar5 + 8) & 0xf;
        if (uVar21 == 7) {
          *(uint *)((long)pvVar5 + 4) =
               ((uint)pAVar10 & 1) + *(int *)(((ulong)pvVar18 & 0xfffffffffffffffe) + 0x10) * 2;
        }
        else {
          uVar19 = *(uint *)((*(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffffe) + 4);
          uVar22 = (int)uVar19 >> 1;
          if (((int)uVar22 < 0) || (uVar1 <= uVar22)) goto LAB_002d6dbc;
          pAVar11 = (Abc_Obj_t *)
                    ((ulong)(((uint)*(ulong *)((long)pvVar5 + 0x18) ^ uVar19) & 1) ^
                    (ulong)ppvVar6[uVar22]);
          if (uVar21 == 6) {
            pAVar10 = Abc_AigXor((Abc_Aig_t *)pAVar9->pManFunc,pAVar10,pAVar11);
          }
          else {
            pAVar10 = Abc_AigAnd((Abc_Aig_t *)pAVar9->pManFunc,pAVar10,pAVar11);
          }
          *(uint *)((long)pvVar5 + 4) =
               ((uint)pAVar10 & 1) + *(int *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x10) * 2;
          iVar8 = pVVar15->nSize;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < iVar8);
    }
    pVVar14 = pNtk->vCos;
    if (0 < pVVar14->nSize) {
      lVar23 = 0;
      do {
        if (pMan->vPos->nSize <= lVar23) goto LAB_002d6dbc;
        uVar17 = *(ulong *)((long)pMan->vPos->pArray[lVar23] + 0x10);
        uVar21 = *(uint *)((uVar17 & 0xfffffffffffffffe) + 4);
        uVar19 = (int)uVar21 >> 1;
        if (((int)uVar19 < 0) || (pAVar9->vObjs->nSize <= (int)uVar19)) goto LAB_002d6dbc;
        Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pVVar14->pArray[lVar23] + 0x40),
                        (Abc_Obj_t *)
                        ((ulong)(((uint)uVar17 ^ uVar21) & 1) ^ (ulong)pAVar9->vObjs->pArray[uVar19]
                        ));
        lVar23 = lVar23 + 1;
        pVVar14 = pNtk->vCos;
      } while (lVar23 < pVVar14->nSize);
    }
    if (pVVar15->pArray != (int *)0x0) {
      free(pVVar15->pArray);
    }
    free(pVVar15);
    iVar8 = Abc_NtkCheck(pAVar9);
    if (iVar8 != 0) goto LAB_002d6d49;
    __ptr = "Abc_NtkFromIvy(): Network check has failed.\n";
    __size = 0x2c;
  }
  else {
    pAVar9 = Abc_NtkStartFromNoLatches(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pAVar10 = Abc_AigConst1(pAVar9);
    pMan->pConst1->TravId =
         ((uint)pAVar10 & 1) + *(int *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x10) * 2;
    pVVar14 = pNtk->vPis;
    uVar17 = (ulong)pVVar14->nSize;
    if (0 < (long)uVar17) {
      pVVar3 = pMan->vPis;
      uVar21 = pVVar3->nSize;
      uVar20 = 0;
      uVar13 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar13 = uVar20;
      }
      do {
        if (uVar13 == uVar20) goto LAB_002d6dbc;
        uVar4 = *(ulong *)((long)pVVar14->pArray[uVar20] + 0x40);
        *(uint *)((long)pVVar3->pArray[uVar20] + 4) =
             ((uint)uVar4 & 1) + *(int *)((uVar4 & 0xfffffffffffffffe) + 0x10) * 2;
        uVar20 = uVar20 + 1;
      } while (uVar17 != uVar20);
    }
    local_48 = pAVar9;
    local_38 = pNtk;
    local_40 = Ivy_ManDfsSeq(pMan,&local_50);
    if (0 < local_50->nSize) {
      lVar23 = 0;
      do {
        pAVar9 = local_48;
        iVar8 = local_50->pArray[lVar23];
        if (((long)iVar8 < 0) || (pMan->vObjs->nSize <= iVar8)) goto LAB_002d6dbc;
        pvVar5 = pMan->vObjs->pArray[iVar8];
        if (pvVar5 == (void *)0x0) break;
        pAVar10 = Abc_NtkCreateObj(local_48,ABC_OBJ_LATCH);
        pAVar11 = Abc_NtkCreateObj(pAVar9,ABC_OBJ_BI);
        pObj = Abc_NtkCreateObj(pAVar9,ABC_OBJ_BO);
        Abc_ObjAddFanin(pAVar10,pAVar11);
        Abc_ObjAddFanin(pObj,pAVar10);
        if (fHaig == 0) {
          switch(*(uint *)((long)pvVar5 + 8) >> 9 & 3) {
          case 0:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIvy.c"
                          ,0x33d,"Abc_Ntk_t *Abc_NtkFromIvySeq(Abc_Ntk_t *, Ivy_Man_t *, int)");
          case 1:
            aVar12 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
            if ((*(uint *)&pAVar10->field_0x14 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
            }
            break;
          case 2:
            aVar12 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
            if ((*(uint *)&pAVar10->field_0x14 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
            }
            break;
          case 3:
            goto switchD_002d6765_caseD_3;
          }
        }
        else {
switchD_002d6765_caseD_3:
          aVar12 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
          if ((*(uint *)&pAVar10->field_0x14 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
          }
        }
        pAVar10->field_5 = aVar12;
        *(uint *)((long)pvVar5 + 4) =
             ((uint)pObj & 1) + *(int *)(((ulong)pObj & 0xfffffffffffffffe) + 0x10) * 2;
        lVar23 = lVar23 + 1;
      } while (lVar23 < local_50->nSize);
    }
    pAVar9 = local_48;
    Abc_NtkAddDummyBoxNames(local_48);
    pNtk = local_38;
    pVVar15 = local_40;
    if (0 < local_40->nSize) {
      lVar23 = 0;
      do {
        iVar8 = pVVar15->pArray[lVar23];
        if (((long)iVar8 < 0) || (pMan->vObjs->nSize <= iVar8)) goto LAB_002d6dbc;
        pvVar5 = pMan->vObjs->pArray[iVar8];
        if (pvVar5 == (void *)0x0) break;
        uVar21 = *(uint *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) + 4);
        uVar19 = (int)uVar21 >> 1;
        if ((int)uVar19 < 0) goto LAB_002d6dbc;
        uVar1 = pAVar9->vObjs->nSize;
        if ((int)uVar1 <= (int)uVar19) goto LAB_002d6dbc;
        ppvVar6 = pAVar9->vObjs->pArray;
        pvVar18 = ppvVar6[uVar19];
        pAVar10 = (Abc_Obj_t *)
                  ((ulong)(((uint)*(ulong *)((long)pvVar5 + 0x10) ^ uVar21) & 1) ^ (ulong)pvVar18);
        uVar21 = *(uint *)((long)pvVar5 + 8) & 0xf;
        if (uVar21 == 7) {
          *(uint *)((long)pvVar5 + 4) =
               ((uint)pAVar10 & 1) + *(int *)(((ulong)pvVar18 & 0xfffffffffffffffe) + 0x10) * 2;
        }
        else {
          uVar19 = *(uint *)((*(ulong *)((long)pvVar5 + 0x18) & 0xfffffffffffffffe) + 4);
          uVar22 = (int)uVar19 >> 1;
          if (((int)uVar22 < 0) || (uVar1 <= uVar22)) goto LAB_002d6dbc;
          pAVar11 = (Abc_Obj_t *)
                    ((ulong)(((uint)*(ulong *)((long)pvVar5 + 0x18) ^ uVar19) & 1) ^
                    (ulong)ppvVar6[uVar22]);
          if (uVar21 == 6) {
            pAVar10 = Abc_AigXor((Abc_Aig_t *)pAVar9->pManFunc,pAVar10,pAVar11);
          }
          else {
            pAVar10 = Abc_AigAnd((Abc_Aig_t *)pAVar9->pManFunc,pAVar10,pAVar11);
          }
          iVar8 = *(int *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x10);
          *(uint *)((long)pvVar5 + 4) = ((uint)pAVar10 & 1) + iVar8 * 2;
          if (((fHaig != 0) && (pvVar18 = *(void **)((long)pvVar5 + 0x48), pvVar18 != (void *)0x0))
             && (0 < *(int *)((long)pvVar5 + 0xc))) {
            uVar21 = iVar8 * 2 >> 1;
            if (((int)uVar21 < 0) || (pAVar9->vObjs->nSize <= (int)uVar21)) goto LAB_002d6dbc;
            if (((ulong)pvVar18 & 1) != 0) {
              __assert_fail("!Ivy_IsComplement(pNode->pEquiv)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIvy.c"
                            ,0x358,"Abc_Ntk_t *Abc_NtkFromIvySeq(Abc_Ntk_t *, Ivy_Man_t *, int)");
            }
            uVar17 = (ulong)((uint)pAVar10 & 1) ^ (ulong)pAVar9->vObjs->pArray[uVar21];
            for (; pvVar18 != pvVar5;
                pvVar18 = (void *)(*(ulong *)((long)pvVar18 + 0x48) & 0xfffffffffffffffe)) {
              uVar21 = (int)*(uint *)((long)pvVar18 + 4) >> 1;
              if (((int)uVar21 < 0) || (pAVar9->vObjs->nSize <= (int)uVar21)) goto LAB_002d6dbc;
              uVar13 = (ulong)(*(uint *)((long)pvVar18 + 4) & 1) ^
                       (ulong)pAVar9->vObjs->pArray[uVar21];
              *(ulong *)(uVar17 + 0x38) = uVar13;
              uVar17 = uVar13;
            }
            *(undefined8 *)(uVar17 + 0x38) = 0;
          }
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < pVVar15->nSize);
    }
    pVVar14 = pNtk->vPos;
    if (0 < pVVar14->nSize) {
      lVar23 = 0;
      do {
        if (pMan->vPos->nSize <= lVar23) goto LAB_002d6dbc;
        uVar17 = *(ulong *)((long)pMan->vPos->pArray[lVar23] + 0x10);
        uVar21 = *(uint *)((uVar17 & 0xfffffffffffffffe) + 4);
        uVar19 = (int)uVar21 >> 1;
        if (((int)uVar19 < 0) || (pAVar9->vObjs->nSize <= (int)uVar19)) goto LAB_002d6dbc;
        Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pVVar14->pArray[lVar23] + 0x40),
                        (Abc_Obj_t *)
                        ((ulong)(((uint)uVar17 ^ uVar21) & 1) ^ (ulong)pAVar9->vObjs->pArray[uVar19]
                        ));
        lVar23 = lVar23 + 1;
        pVVar14 = pNtk->vPos;
      } while (lVar23 < pVVar14->nSize);
    }
    if (0 < local_50->nSize) {
      lVar23 = 0;
LAB_002d69f0:
      iVar8 = local_50->pArray[lVar23];
      if (((long)iVar8 < 0) || (pMan->vObjs->nSize <= iVar8)) {
LAB_002d6dbc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar5 = pMan->vObjs->pArray[iVar8];
      if (pvVar5 != (void *)0x0) {
        uVar17 = *(ulong *)((long)pvVar5 + 0x10);
        uVar21 = *(uint *)((uVar17 & 0xfffffffffffffffe) + 4);
        uVar19 = (int)uVar21 >> 1;
        if ((((int)uVar19 < 0) || (pAVar9->vObjs->nSize <= (int)uVar19)) ||
           (pAVar9->vBoxes->nSize <= lVar23)) goto LAB_002d6dbc;
        plVar7 = (long *)pAVar9->vBoxes->pArray[lVar23];
        Abc_ObjAddFanin(*(Abc_Obj_t **)
                         (*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[4] * 8),
                        (Abc_Obj_t *)
                        ((ulong)(((uint)uVar17 ^ uVar21) & 1) ^ (ulong)pAVar9->vObjs->pArray[uVar19]
                        ));
        lVar23 = lVar23 + 1;
        if (lVar23 < local_50->nSize) goto LAB_002d69f0;
      }
    }
    if (local_50->pArray != (int *)0x0) {
      free(local_50->pArray);
    }
    free(local_50);
    if (pVVar15->pArray != (int *)0x0) {
      free(pVVar15->pArray);
    }
    free(pVVar15);
    iVar8 = Abc_NtkCheck(pAVar9);
    if (iVar8 != 0) goto LAB_002d6d49;
    __ptr = "Abc_NtkFromIvySeq(): Network check has failed.\n";
    __size = 0x2f;
  }
  fwrite(__ptr,__size,1,_stdout);
LAB_002d6d49:
  if ((fHaig == 0) && (uVar21 = Abc_AigCleanup((Abc_Aig_t *)pAVar9->pManFunc), uVar21 != 0)) {
    printf("Warning: AIG cleanup removed %d nodes (this is not a bug).\n",(ulong)uVar21);
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar16 = Abc_NtkDup(pNtk->pExdc);
    pAVar9->pExdc = pAVar16;
  }
  iVar8 = Abc_NtkCheck(pAVar9);
  if (iVar8 == 0) {
    puts("Abc_NtkStrash: The network check has failed.");
    Abc_NtkDelete(pAVar9);
    pAVar9 = (Abc_Ntk_t *)0x0;
  }
  return pAVar9;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyAfter( Abc_Ntk_t * pNtk, Ivy_Man_t * pMan, int fSeq, int fHaig )
{
    Abc_Ntk_t * pNtkAig;
    int nNodes, fCleanup = 1;
    // convert from the AIG manager
    if ( fSeq )
        pNtkAig = Abc_NtkFromIvySeq( pNtk, pMan, fHaig );
    else
        pNtkAig = Abc_NtkFromIvy( pNtk, pMan );
    // report the cleanup results
    if ( !fHaig && fCleanup && (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) )
        printf( "Warning: AIG cleanup removed %d nodes (this is not a bug).\n", nNodes );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;
}